

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_type(lysp_yang_ctx *ctx,lysp_type *type)

{
  uint8_t *puVar1;
  long *plVar2;
  char cVar3;
  lysp_type *plVar4;
  lyd_node **pplVar5;
  lyd_node *plVar6;
  size_t sVar7;
  ushort uVar8;
  LY_ERR LVar9;
  LY_ERR LVar10;
  int iVar11;
  long *plVar12;
  lysp_restr *plVar13;
  ushort **ppuVar14;
  size_t sVar15;
  code *exts;
  int *piVar16;
  ulonglong uVar17;
  uint uVar18;
  char *pcVar19;
  long lVar20;
  size_t *word_len_00;
  lysp_ext_instance **pplVar21;
  char *format;
  uint16_t *flags;
  ly_ctx *plVar22;
  LY_ERR ret__;
  lysp_ext_instance *plVar23;
  char *pcVar24;
  lysp_ext_instance **pplVar25;
  ly_stmt lVar26;
  bool bVar27;
  undefined2 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff12;
  undefined4 in_stack_ffffffffffffff14;
  char *word_1;
  size_t word_len_4;
  lysp_ext_instance **local_d0;
  size_t word_len_1;
  char *word_2;
  char *buf_1;
  ly_stmt kw;
  ly_stmt local_a8;
  ly_stmt local_a4;
  lysp_ext_instance *local_a0;
  lysp_ext_instance **local_98;
  char *word;
  size_t word_len;
  size_t word_len_2;
  char *str_path;
  lyxp_expr **local_70;
  lysp_ext_instance **local_68;
  lysp_ext_instance **local_60;
  lysp_ext_instance **local_58;
  char ***local_50;
  lysp_type_enum **local_48;
  lysp_type_enum **local_40;
  char *buf;
  
  str_path = (char *)0x0;
  LVar10 = LY_EVALID;
  if (type->name == (char *)0x0) {
    exts = (code *)&buf;
    LVar9 = get_argument(ctx,Y_PREF_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts,&word_len);
    if (LVar9 != LY_SUCCESS) {
      return LVar9;
    }
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar22 = (ly_ctx *)0x0;
      }
      else {
        plVar22 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar24 = word;
      if (word_len == 0) {
        pcVar24 = "";
      }
      LVar9 = lydict_insert(plVar22,pcVar24,word_len,&type->name);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar22 = (ly_ctx *)0x0;
      }
      else {
        plVar22 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar9 = lydict_insert_zc(plVar22,word,&type->name);
    }
    if (LVar9 != LY_SUCCESS) {
      return LVar9;
    }
    type->pmod = (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    word_len_00 = &word_len;
    LVar9 = get_keyword(ctx,&kw,&word,word_len_00);
    if (LVar9 != LY_SUCCESS) {
      return LVar9;
    }
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar27 = false;
    }
    else {
      if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
        plVar22 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        pcVar24 = lyplg_ext_stmt2str(kw);
        pcVar19 = "Invalid keyword \"%s\", expected \";\" or \"{\".";
        goto LAB_0016de83;
      }
      word_len_00 = &word_len;
      LVar10 = get_keyword(ctx,&kw,&word,word_len_00);
      if (LVar10 != LY_SUCCESS) {
        return LVar10;
      }
      bVar27 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
    }
    pplVar25 = &type->exts;
    local_70 = &type->path;
    local_40 = &type->enums;
    local_48 = &type->bits;
    local_50 = &type->bases;
    lVar26 = kw;
    do {
      do {
        if (!bVar27) {
          return LY_SUCCESS;
        }
        if (lVar26 == LY_STMT_TYPE) {
          plVar4 = type->types;
          if (plVar4 == (lysp_type *)0x0) {
            plVar12 = (long *)malloc(0x70);
            if (plVar12 != (long *)0x0) {
              *plVar12 = 1;
              lVar20 = 1;
              goto LAB_0016e321;
            }
          }
          else {
            lVar20 = *(long *)&plVar4[-1].fraction_digits;
            *(long *)&plVar4[-1].fraction_digits = lVar20 + 1;
            plVar12 = (long *)realloc(&plVar4[-1].fraction_digits,lVar20 * 0x68 + 0x70);
            if (plVar12 != (long *)0x0) {
              lVar20 = *plVar12;
LAB_0016e321:
              type->types = (lysp_type *)(plVar12 + 1);
              plVar12 = plVar12 + lVar20 * 0xd;
              plVar12[-2] = 0;
              plVar12[-1] = 0;
              plVar12[-4] = 0;
              plVar12[-3] = 0;
              plVar12[-6] = 0;
              plVar12[-5] = 0;
              plVar12[-8] = 0;
              plVar12[-7] = 0;
              plVar12[-10] = 0;
              plVar12[-9] = 0;
              ((lysp_type *)(plVar12 + -0xc))->name = (char *)0x0;
              plVar12[-0xb] = 0;
              *plVar12 = 0;
              LVar10 = parse_type(ctx,(lysp_type *)(plVar12 + -0xc));
              uVar8 = 0x100;
              goto LAB_0016e4ba;
            }
            puVar1 = &type->types[-1].fraction_digits;
            *(long *)puVar1 = *(long *)puVar1 + -1;
          }
LAB_0016efe4:
          plVar22 = (ly_ctx *)
                    **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
          ;
          pcVar24 = "parse_type";
          goto LAB_0016f038;
        }
        if (lVar26 == LY_STMT_BIT) {
          LVar10 = parse_type_enum(ctx,LY_STMT_BIT,local_48);
          uVar8 = 2;
LAB_0016e4ba:
          if (LVar10 != LY_SUCCESS) {
            return LVar10;
          }
LAB_0016e4c2:
          type->flags = type->flags | uVar8;
        }
        else {
          if (lVar26 == LY_STMT_ENUM) {
            LVar10 = parse_type_enum(ctx,LY_STMT_ENUM,local_40);
            uVar8 = 4;
            goto LAB_0016e4ba;
          }
          if (lVar26 != LY_STMT_EXTENSION_INSTANCE) {
            if (lVar26 == LY_STMT_FRACTION_DIGITS) {
              buf_1 = (char *)0x0;
              if (type->fraction_digits != '\0') {
                plVar22 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                pcVar24 = "fraction-digits";
LAB_0016ef4a:
                buf_1 = (char *)0x0;
                pcVar19 = "Duplicate keyword \"%s\".";
                goto LAB_0016efc0;
              }
              exts = (code *)&buf_1;
              LVar10 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word_1,(char **)exts,&word_len_4)
              ;
              sVar7 = word_len_4;
              pcVar24 = word_1;
              if (LVar10 != LY_SUCCESS) goto LAB_0016e4ac;
              local_d0 = pplVar25;
              if (((word_len_4 == 0) || (cVar3 = *word_1, (long)cVar3 == 0x30)) ||
                 (ppuVar14 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar14 + (long)cVar3 * 2 + 1) & 8) == 0)) {
                plVar22 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                pcVar19 = "Invalid value \"%.*s\" of \"%s\".";
                pcVar24 = word_1;
LAB_0016e49d:
                exts = (code *)(sVar7 & 0xffffffff);
                ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,pcVar19,exts,pcVar24,"fraction-digits")
                ;
LAB_0016e4a4:
                LVar10 = LY_EVALID;
                pplVar25 = local_d0;
              }
              else {
                piVar16 = __errno_location();
                *piVar16 = 0;
                uVar17 = strtoull(pcVar24,(char **)&word_len_1,10);
                if (word_len_1 - (long)pcVar24 != sVar7) {
                  plVar22 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  pcVar19 = "Invalid value \"%.*s\" of \"%s\".";
                  goto LAB_0016e49d;
                }
                if (0x12 < uVar17 || *piVar16 == 0x22) {
                  plVar22 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  pcVar19 = "Value \"%.*s\" is out of \"%s\" bounds.";
                  goto LAB_0016e49d;
                }
                type->fraction_digits = (uint8_t)uVar17;
                LVar10 = get_keyword(ctx,(ly_stmt *)&word_2,&word_1,&word_len_4);
                pplVar25 = local_d0;
                if (LVar10 == LY_SUCCESS) {
                  if ((ly_stmt)word_2 == LY_STMT_SYNTAX_SEMICOLON) {
                    bVar27 = true;
                    lVar26 = LY_STMT_SYNTAX_SEMICOLON;
                    goto LAB_0016ed5e;
                  }
                  if ((ly_stmt)word_2 == LY_STMT_SYNTAX_LEFT_BRACE) {
                    do {
                      LVar10 = get_keyword(ctx,(ly_stmt *)&word_2,&word_1,&word_len_4);
                      pplVar25 = local_d0;
                      if (LVar10 != LY_SUCCESS) break;
                      bVar27 = (ly_stmt)word_2 == LY_STMT_SYNTAX_RIGHT_BRACE;
                      lVar26 = (ly_stmt)word_2;
LAB_0016ed5e:
                      if (bVar27) {
                        LVar10 = LY_SUCCESS;
                        pplVar25 = local_d0;
                        break;
                      }
                      if (lVar26 != LY_STMT_EXTENSION_INSTANCE) {
                        plVar22 = (ly_ctx *)
                                  **(undefined8 **)
                                    (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                        exts = (code *)lyplg_ext_stmt2str(lVar26);
                        ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,
                                "Invalid keyword \"%s\" as a child of \"%s\".");
                        goto LAB_0016e4a4;
                      }
                      exts = (code *)0x110000;
                      LVar10 = parse_ext(ctx,word_1,word_len_4,type,LY_STMT_FRACTION_DIGITS,0,
                                         local_d0);
                      pplVar25 = local_d0;
                    } while (LVar10 == LY_SUCCESS);
                    goto LAB_0016e4ac;
                  }
                  plVar22 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  exts = (code *)lyplg_ext_stmt2str((ly_stmt)word_2);
                  ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,
                          "Invalid keyword \"%s\", expected \";\" or \"{\".");
                  goto LAB_0016e4a4;
                }
              }
LAB_0016e4ac:
              free(buf_1);
              uVar8 = 8;
              goto LAB_0016e4ba;
            }
            if (lVar26 == LY_STMT_LENGTH) {
              if (type->length != (lysp_restr *)0x0) {
                plVar22 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                lVar26 = LY_STMT_LENGTH;
LAB_0016efa9:
                pcVar24 = lyplg_ext_stmt2str(lVar26);
                pcVar19 = "Duplicate keyword \"%s\".";
                goto LAB_0016efc0;
              }
              plVar13 = (lysp_restr *)calloc(1,0x40);
              type->length = plVar13;
              if (plVar13 == (lysp_restr *)0x0) goto LAB_0016efe4;
              LVar10 = parse_restr(ctx,LY_STMT_LENGTH,plVar13);
              uVar8 = 0x10;
              goto LAB_0016e4ba;
            }
            if (lVar26 == LY_STMT_PATH) {
              if (*local_70 != (lyxp_expr *)0x0) {
                plVar22 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                lVar26 = LY_STMT_PATH;
                goto LAB_0016efa9;
              }
              LVar10 = parse_text_field(ctx,type,LY_STMT_PATH,(uint32_t)&str_path,(char **)0x2,
                                        Y_IDENTIF_ARG,(uint16_t *)pplVar25,
                                        (lysp_ext_instance **)
                                        CONCAT44(in_stack_ffffffffffffff14,
                                                 CONCAT22(in_stack_ffffffffffffff12,
                                                          in_stack_ffffffffffffff10)));
              plVar22 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (LVar10 != LY_SUCCESS) {
                lydict_remove(plVar22,str_path);
                return LVar10;
              }
              in_stack_ffffffffffffff10 = 0x400;
              in_stack_ffffffffffffff12 = 0;
              exts = (code *)0x1;
              LVar10 = ly_path_parse(plVar22,(lysc_node *)0x0,str_path,0,'\x01',2,0x10,0x400,
                                     local_70);
              lydict_remove((ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                            str_path);
              uVar8 = 0x20;
              goto LAB_0016e4ba;
            }
            if (lVar26 != LY_STMT_PATTERN) {
              if (lVar26 == LY_STMT_RANGE) {
                if (type->range != (lysp_restr *)0x0) {
                  plVar22 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  lVar26 = LY_STMT_RANGE;
                  goto LAB_0016efa9;
                }
                plVar13 = (lysp_restr *)calloc(1,0x40);
                type->range = plVar13;
                if (plVar13 == (lysp_restr *)0x0) goto LAB_0016efe4;
                LVar10 = parse_restr(ctx,LY_STMT_RANGE,plVar13);
                uVar8 = 0x80;
              }
              else {
                if (lVar26 == LY_STMT_REQUIRE_INSTANCE) {
                  buf_1 = (char *)0x0;
                  if ((type->flags >> 9 & 1) != 0) {
                    plVar22 = (ly_ctx *)
                              **(undefined8 **)
                                (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    pcVar24 = "require-instance";
                    goto LAB_0016ef4a;
                  }
                  type->flags = type->flags | 0x200;
                  exts = (code *)&buf_1;
                  LVar10 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word_1,(char **)exts,
                                        &word_len_1);
                  sVar7 = word_len_1;
                  if (LVar10 != LY_SUCCESS) goto LAB_0016eafd;
                  if (word_len_1 == 5) {
                    iVar11 = strncmp(word_1,"false",5);
                    if (iVar11 == 0) goto LAB_0016eb14;
LAB_0016eabd:
                    exts = (code *)(sVar7 & 0xffffffff);
                    ly_vlog((ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                            (char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",exts,
                            word_1,"require-instance");
LAB_0016eafa:
                    LVar10 = LY_EVALID;
                  }
                  else {
                    if ((word_len_1 != 4) || (iVar11 = strncmp(word_1,"true",4), iVar11 != 0))
                    goto LAB_0016eabd;
                    type->require_instance = '\x01';
LAB_0016eb14:
                    LVar10 = get_keyword(ctx,(ly_stmt *)&word_len_4,&word_1,&word_len_1);
                    if (LVar10 == LY_SUCCESS) {
                      if ((ly_stmt)word_len_4 == LY_STMT_SYNTAX_SEMICOLON) {
                        bVar27 = true;
                        lVar26 = LY_STMT_SYNTAX_SEMICOLON;
                        goto LAB_0016ecb2;
                      }
                      if ((ly_stmt)word_len_4 == LY_STMT_SYNTAX_LEFT_BRACE) {
                        do {
                          LVar10 = get_keyword(ctx,(ly_stmt *)&word_len_4,&word_1,&word_len_1);
                          if (LVar10 != LY_SUCCESS) break;
                          bVar27 = (ly_stmt)word_len_4 == LY_STMT_SYNTAX_RIGHT_BRACE;
                          lVar26 = (ly_stmt)word_len_4;
LAB_0016ecb2:
                          if (bVar27) {
                            LVar10 = LY_SUCCESS;
                            break;
                          }
                          if (lVar26 != LY_STMT_EXTENSION_INSTANCE) {
                            plVar22 = (ly_ctx *)
                                      **(undefined8 **)
                                        (ctx->parsed_mods->field_2).dnodes
                                        [ctx->parsed_mods->count - 1];
                            exts = (code *)lyplg_ext_stmt2str(lVar26);
                            ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,
                                    "Invalid keyword \"%s\" as a child of \"%s\".");
                            goto LAB_0016eafa;
                          }
                          exts = (code *)0x290000;
                          LVar10 = parse_ext(ctx,word_1,word_len_1,type,LY_STMT_REQUIRE_INSTANCE,0,
                                             pplVar25);
                        } while (LVar10 == LY_SUCCESS);
                        goto LAB_0016eafd;
                      }
                      plVar22 = (ly_ctx *)
                                **(undefined8 **)
                                  (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      exts = (code *)lyplg_ext_stmt2str((ly_stmt)word_len_4);
                      ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,
                              "Invalid keyword \"%s\", expected \";\" or \"{\".");
                      goto LAB_0016eafa;
                    }
                  }
LAB_0016eafd:
                  free(buf_1);
                  if (LVar10 != LY_SUCCESS) {
                    return LVar10;
                  }
                  goto LAB_0016e4c7;
                }
                if (lVar26 != LY_STMT_BASE) {
                  plVar22 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  pcVar24 = lyplg_ext_stmt2str(lVar26);
                  pcVar19 = "type";
LAB_0016eee7:
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0016eef2:
                  ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar24,pcVar19);
                  return LY_EVALID;
                }
                LVar10 = parse_text_fields(ctx,(ly_stmt)local_50,(char ***)pplVar25,
                                           (yang_arg)word_len_00,(lysp_ext_instance **)exts);
                uVar8 = 1;
              }
              goto LAB_0016e4ba;
            }
            plVar13 = type->patterns;
            if (plVar13 == (lysp_restr *)0x0) {
              local_d0 = pplVar25;
              plVar12 = (long *)malloc(0x48);
              if (plVar12 != (long *)0x0) {
                *plVar12 = 1;
                lVar20 = 1;
                goto LAB_0016e386;
              }
LAB_0016f013:
              plVar22 = (ly_ctx *)
                        **(undefined8 **)
                          (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              pcVar24 = "parse_type_pattern";
LAB_0016f038:
              ly_log(plVar22,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar24);
              return LY_EMEM;
            }
            plVar23 = (lysp_ext_instance *)((long)&(plVar13[-1].exts)->name + 1);
            plVar13[-1].exts = plVar23;
            local_d0 = pplVar25;
            plVar12 = (long *)realloc(&plVar13[-1].exts,(long)plVar23 * 0x40 | 8);
            if (plVar12 == (long *)0x0) {
              pplVar25 = &type->patterns[-1].exts;
              *pplVar25 = (lysp_ext_instance *)((long)&(*pplVar25)[-1].exts + 7);
              goto LAB_0016f013;
            }
            lVar20 = *plVar12;
LAB_0016e386:
            type->patterns = (lysp_restr *)(plVar12 + 1);
            plVar2 = plVar12 + lVar20 * 8;
            flags = (uint16_t *)(plVar2 + -5);
            plVar2[-1] = 0;
            *plVar2 = 0;
            plVar2[-3] = 0;
            plVar2[-2] = 0;
            flags[0] = 0;
            flags[1] = 0;
            flags[2] = 0;
            flags[3] = 0;
            plVar2[-4] = 0;
            plVar2[-7] = 0;
            plVar2[-6] = 0;
            exts = (code *)&word_len_4;
            LVar10 = get_argument(ctx,Y_STR_ARG,flags,&word_2,(char **)exts,&word_len_2);
            sVar7 = word_len_2;
            if (LVar10 != LY_SUCCESS) {
              return LVar10;
            }
            if (word_len_4 == 0) {
              word_len_4 = (size_t)malloc(word_len_2 + 2);
            }
            else {
              word_len_4 = (size_t)ly_realloc((void *)word_len_4,word_len_2 + 2);
              word_2 = (char *)word_len_4;
            }
            if ((char *)word_len_4 == (char *)0x0) goto LAB_0016f013;
            if (sVar7 != 0) {
              memmove((char *)(word_len_4 + 1),word_2,sVar7);
            }
            local_a0 = (lysp_ext_instance *)(plVar12 + lVar20 * 8 + -7);
            *(undefined1 *)word_len_4 = 6;
            *(undefined1 *)(word_len_4 + 1 + sVar7) = 0;
            LVar10 = lydict_insert_zc((ly_ctx *)
                                      **(undefined8 **)
                                        (ctx->parsed_mods->field_2).dnodes
                                        [ctx->parsed_mods->count - 1],(char *)word_len_4,
                                      (char **)local_a0);
            if (LVar10 != LY_SUCCESS) {
              return LVar10;
            }
            pplVar25 = (lysp_ext_instance **)(plVar12 + lVar20 * 8);
            pplVar25[-6] = (lysp_ext_instance *)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            LVar10 = get_keyword(ctx,&local_a8,&word_2,&word_len_2);
            if (LVar10 != LY_SUCCESS) {
              return LVar10;
            }
            if (local_a8 == LY_STMT_SYNTAX_SEMICOLON) {
              bVar27 = false;
            }
            else {
              if (local_a8 != LY_STMT_SYNTAX_LEFT_BRACE) {
                plVar22 = (ly_ctx *)
                          **(undefined8 **)
                            (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                pcVar24 = lyplg_ext_stmt2str(local_a8);
                pcVar19 = "Invalid keyword \"%s\", expected \";\" or \"{\".";
LAB_0016efc0:
                ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,pcVar19,pcVar24);
                return LY_EVALID;
              }
              LVar10 = get_keyword(ctx,&local_a8,&word_2,&word_len_2);
              if (LVar10 != LY_SUCCESS) {
                return LVar10;
              }
              bVar27 = local_a8 != LY_STMT_SYNTAX_RIGHT_BRACE;
            }
            local_58 = pplVar25 + -4;
            local_60 = pplVar25 + -3;
            local_68 = pplVar25 + -1;
            lVar26 = local_a8;
            local_98 = pplVar25;
            while (bVar27) {
              if (lVar26 == LY_STMT_REFERENCE) {
                plVar23 = *local_68;
                lVar26 = LY_STMT_REFERENCE;
                pplVar21 = local_68;
LAB_0016e7af:
                exts = (code *)0x2;
                LVar10 = parse_text_field(ctx,plVar23,lVar26,(uint32_t)pplVar21,(char **)0x2,
                                          Y_IDENTIF_ARG,(uint16_t *)local_98,
                                          (lysp_ext_instance **)
                                          CONCAT44(in_stack_ffffffffffffff14,
                                                   CONCAT22(in_stack_ffffffffffffff12,
                                                            in_stack_ffffffffffffff10)));
              }
              else {
                plVar23 = local_a0;
                if (lVar26 == LY_STMT_ERROR_APP_TAG) {
                  lVar26 = LY_STMT_ERROR_APP_TAG;
                  pplVar21 = local_60;
                  goto LAB_0016e7af;
                }
                if (lVar26 == LY_STMT_ERROR_MESSAGE) {
                  lVar26 = LY_STMT_ERROR_MESSAGE;
                  pplVar21 = local_58;
                  goto LAB_0016e7af;
                }
                if (lVar26 == LY_STMT_EXTENSION_INSTANCE) {
                  exts = (code *)0x220000;
                  LVar10 = parse_ext(ctx,word_2,word_len_2,local_a0,LY_STMT_PATTERN,0,local_98);
                }
                else {
                  if (lVar26 != LY_STMT_MODIFIER) {
                    if (lVar26 == LY_STMT_DESCRIPTION) {
                      lVar26 = LY_STMT_DESCRIPTION;
                      pplVar21 = pplVar25 + -2;
                      plVar23 = pplVar25[-2];
                      goto LAB_0016e7af;
                    }
                    plVar22 = (ly_ctx *)
                              **(undefined8 **)
                                (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    pcVar24 = lyplg_ext_stmt2str(lVar26);
                    pcVar19 = "pattern";
                    goto LAB_0016eee7;
                  }
                  pplVar5 = (ctx->parsed_mods->field_2).dnodes;
                  uVar18 = ctx->parsed_mods->count - 1;
                  plVar6 = pplVar5[uVar18];
                  if (*(byte *)&plVar6[2].schema < 2) {
                    plVar22 = (ly_ctx *)**(undefined8 **)plVar6;
                    format = 
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ;
                    pcVar24 = "modifier";
                    pcVar19 = "pattern";
                    goto LAB_0016eef2;
                  }
                  buf_1 = (char *)0x0;
                  if (*local_a0->name == '\x15') {
                    plVar22 = (ly_ctx *)**(undefined8 **)pplVar5[uVar18];
                    pcVar24 = "modifier";
                    goto LAB_0016ef4a;
                  }
                  pcVar24 = (char *)&buf_1;
                  LVar10 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word_1,(char **)pcVar24,
                                        &word_len_1);
                  sVar7 = word_len_1;
                  pcVar19 = word_1;
                  if (LVar10 == LY_SUCCESS) {
                    if ((word_len_1 == 0xc) &&
                       (iVar11 = strncmp(word_1,"invert-match",0xc), iVar11 == 0)) {
                      pcVar19 = local_a0->name;
                      sVar15 = strlen(pcVar19);
                      buf_1 = (char *)malloc(sVar15 + 1);
                      if (buf_1 == (char *)0x0) {
                        LVar10 = LY_EMEM;
                        pcVar24 = "parse_type_pattern_modifier";
                        ly_log((ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                               LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
                      }
                      else {
                        strcpy(buf_1,pcVar19);
                        lydict_remove((ly_ctx *)
                                      **(undefined8 **)
                                        (ctx->parsed_mods->field_2).dnodes
                                        [ctx->parsed_mods->count - 1],pcVar19);
                        if (*buf_1 != '\x06') {
                          __assert_fail("buf[0] == LYSP_RESTR_PATTERN_ACK",
                                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                                        ,0x855,
                                        "LY_ERR parse_type_pattern_modifier(struct lysp_yang_ctx *, struct lysp_restr *)"
                                       );
                        }
                        *buf_1 = '\x15';
                        LVar10 = lydict_insert_zc((ly_ctx *)
                                                  **(undefined8 **)
                                                    (ctx->parsed_mods->field_2).dnodes
                                                    [ctx->parsed_mods->count - 1],buf_1,
                                                  &local_a0->name);
                        buf_1 = (char *)0x0;
                        if ((LVar10 == LY_SUCCESS) &&
                           (LVar10 = get_keyword(ctx,&local_a4,&word_1,&word_len_1),
                           LVar10 == LY_SUCCESS)) {
                          if (local_a4 == LY_STMT_SYNTAX_SEMICOLON) {
                            bVar27 = true;
                            goto LAB_0016e9e4;
                          }
                          if (local_a4 != LY_STMT_SYNTAX_LEFT_BRACE) {
                            plVar22 = (ly_ctx *)
                                      **(undefined8 **)
                                        (ctx->parsed_mods->field_2).dnodes
                                        [ctx->parsed_mods->count - 1];
                            pcVar24 = lyplg_ext_stmt2str(local_a4);
                            ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,
                                    "Invalid keyword \"%s\", expected \";\" or \"{\".");
                            goto LAB_0016e889;
                          }
                          do {
                            LVar10 = get_keyword(ctx,&local_a4,&word_1,&word_len_1);
                            if (LVar10 != LY_SUCCESS) break;
                            bVar27 = local_a4 == LY_STMT_SYNTAX_RIGHT_BRACE;
LAB_0016e9e4:
                            if (bVar27) {
                              LVar10 = LY_SUCCESS;
                              break;
                            }
                            if (local_a4 != LY_STMT_EXTENSION_INSTANCE) {
                              plVar22 = (ly_ctx *)
                                        **(undefined8 **)
                                          (ctx->parsed_mods->field_2).dnodes
                                          [ctx->parsed_mods->count - 1];
                              pcVar24 = lyplg_ext_stmt2str(local_a4);
                              ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,
                                      "Invalid keyword \"%s\" as a child of \"%s\".");
                              goto LAB_0016e889;
                            }
                            pcVar24 = (char *)0x1b0000;
                            LVar10 = parse_ext(ctx,word_1,word_len_1,local_a0,LY_STMT_MODIFIER,0,
                                               local_98);
                          } while (LVar10 == LY_SUCCESS);
                        }
                      }
                    }
                    else {
                      pcVar24 = (char *)(sVar7 & 0xffffffff);
                      ly_vlog((ly_ctx *)
                              **(undefined8 **)
                                (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                              (char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                              pcVar24,pcVar19,"modifier");
LAB_0016e889:
                      LVar10 = LY_EVALID;
                    }
                  }
                  free(buf_1);
                  exts = (code *)pcVar24;
                }
              }
              if (LVar10 != LY_SUCCESS) {
                return LVar10;
              }
              LVar10 = get_keyword(ctx,&local_a8,&word_2,&word_len_2);
              lVar26 = local_a8;
              if (LVar10 != LY_SUCCESS) {
                return LVar10;
              }
              bVar27 = local_a8 != LY_STMT_SYNTAX_RIGHT_BRACE;
              if (((!bVar27) && (*local_98 != (lysp_ext_instance *)0x0)) &&
                 (LVar10 = ly_set_add(&ctx->main_ctx->ext_inst,*local_98,'\x01',(uint32_t *)0x0),
                 LVar10 != LY_SUCCESS)) {
                return LVar10;
              }
            }
            uVar8 = 0x40;
            pplVar25 = local_d0;
            goto LAB_0016e4c2;
          }
          exts = (code *)0x2e0000;
          LVar10 = parse_ext(ctx,word,word_len,type,LY_STMT_TYPE,0,pplVar25);
          if (LVar10 != LY_SUCCESS) {
            return LVar10;
          }
        }
LAB_0016e4c7:
        word_len_00 = &word_len;
        LVar10 = get_keyword(ctx,&kw,&word,word_len_00);
        lVar26 = kw;
        if (LVar10 != LY_SUCCESS) {
          return LVar10;
        }
        bVar27 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
      } while ((bVar27) || (*pplVar25 == (lysp_ext_instance *)0x0));
      word_len_00 = (size_t *)0x0;
      LVar10 = ly_set_add(&ctx->main_ctx->ext_inst,*pplVar25,'\x01',(uint32_t *)0x0);
    } while (LVar10 == LY_SUCCESS);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar22 = (ly_ctx *)0x0;
    }
    else {
      plVar22 = (ly_ctx *)
                **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar19 = "Duplicate keyword \"%s\".";
    pcVar24 = "type";
LAB_0016de83:
    ly_vlog(plVar22,(char *)0x0,LYVE_SYNTAX_YANG,pcVar19,pcVar24);
  }
  return LVar10;
}

Assistant:

static LY_ERR
parse_type(struct lysp_yang_ctx *ctx, struct lysp_type *type)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    const char *str_path = NULL;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_type *nest_type;

    if (type->name) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "type");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_PREF_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, type->name, word, word_len, ret, cleanup);

    /* set module */
    type->pmod = PARSER_CUR_PMOD(ctx);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_BASE:
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &type->bases, Y_PREF_IDENTIF_ARG, &type->exts));
            type->flags |= LYS_SET_BASE;
            break;
        case LY_STMT_BIT:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->bits));
            type->flags |= LYS_SET_BIT;
            break;
        case LY_STMT_ENUM:
            LY_CHECK_RET(parse_type_enum(ctx, kw, &type->enums));
            type->flags |= LYS_SET_ENUM;
            break;
        case LY_STMT_FRACTION_DIGITS:
            LY_CHECK_RET(parse_type_fracdigits(ctx, type));
            type->flags |= LYS_SET_FRDIGITS;
            break;
        case LY_STMT_LENGTH:
            if (type->length) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->length = calloc(1, sizeof *type->length);
            LY_CHECK_ERR_RET(!type->length, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->length));
            type->flags |= LYS_SET_LENGTH;
            break;
        case LY_STMT_PATH:
            if (type->path) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(LY_STMT_PATH));
                return LY_EVALID;
            }

            /* Usually, in the parser_yang.c, the result of the parsing is stored directly in the
             * corresponding structure, so in case of failure, the lysp_module_free function will take
             * care of removing the parsed value from the dictionary. But in this case, it is not possible
             * to rely on lysp_module_free because the result of the parsing is stored in a local variable.
             */
            LY_CHECK_ERR_RET(ret = parse_text_field(ctx, type, LY_STMT_PATH, 0, &str_path, Y_STR_ARG, NULL, &type->exts),
                    lydict_remove(PARSER_CTX(ctx), str_path), ret);
            ret = ly_path_parse(PARSER_CTX(ctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                    LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, &type->path);
            /* Moreover, even if successful, the string is removed from the dictionary. */
            lydict_remove(PARSER_CTX(ctx), str_path);
            LY_CHECK_RET(ret);
            type->flags |= LYS_SET_PATH;
            break;
        case LY_STMT_PATTERN:
            LY_CHECK_RET(parse_type_pattern(ctx, &type->patterns));
            type->flags |= LYS_SET_PATTERN;
            break;
        case LY_STMT_RANGE:
            if (type->range) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(kw));
                return LY_EVALID;
            }
            type->range = calloc(1, sizeof *type->range);
            LY_CHECK_ERR_RET(!type->range, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(parse_restr(ctx, kw, type->range));
            type->flags |= LYS_SET_RANGE;
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            LY_CHECK_RET(parse_type_reqinstance(ctx, type));
            /* LYS_SET_REQINST checked and set inside parse_type_reqinstance() */
            break;
        case LY_STMT_TYPE:
            LY_ARRAY_NEW_RET(PARSER_CTX(ctx), type->types, nest_type, LY_EMEM);
            LY_CHECK_RET(parse_type(ctx, nest_type));
            type->flags |= LYS_SET_TYPE;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, type, LY_STMT_TYPE, 0, &type->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "type");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, type->exts, ret, cleanup);
    }

cleanup:
    return ret;
}